

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::changeRhs
          (SPxSolverBase<double> *this,int i,double *newRhs,bool scale)

{
  double dVar1;
  SPxScaler<double> *pSVar2;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar3;
  
  dVar1 = *newRhs;
  if (((int)CONCAT71(in_register_00000009,scale) == 0) ||
     ((this->super_SPxLPBase<double>)._isScaled != true)) {
    dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
  }
  else {
    pSVar2 = (this->super_SPxLPBase<double>).lp_scaler;
    (*pSVar2->_vptr_SPxScaler[0x1d])(pSVar2,this,i);
    dVar3 = extraout_XMM0_Qa;
  }
  if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
    dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    SPxLPBase<double>::changeRhs(&this->super_SPxLPBase<double>,i,newRhs,scale);
    if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
                ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[i],dVar1,this,i);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRhs(int i, const R& newRhs, bool scale)
{
   if(newRhs != (scale ? this->rhsUnscaled(i) : this->rhs(i)))
   {
      forceRecompNonbasicValue();

      R oldRhs = this->rhs(i);
      SPxLPBase<R>::changeRhs(i, newRhs, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeRhsStatus(i, this->rhs(i), oldRhs);
         unInit();
      }
   }
}